

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

void opj_tls_destroy(opj_tls_t *tls)

{
  opj_tls_key_val_t *ptr;
  code *pcVar1;
  long lVar2;
  long lVar3;
  
  if (tls != (opj_tls_t *)0x0) {
    lVar2 = 0x10;
    for (lVar3 = 0; ptr = tls->key_val, lVar3 < tls->key_val_count; lVar3 = lVar3 + 1) {
      pcVar1 = *(code **)((long)&ptr->key + lVar2);
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)(*(undefined8 *)((long)ptr + lVar2 + -8));
      }
      lVar2 = lVar2 + 0x18;
    }
    opj_free(ptr);
    opj_free(tls);
    return;
  }
  return;
}

Assistant:

static void opj_tls_destroy(opj_tls_t* tls)
{
    int i;
    if (!tls) {
        return;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].opj_free_func) {
            tls->key_val[i].opj_free_func(tls->key_val[i].value);
        }
    }
    opj_free(tls->key_val);
    opj_free(tls);
}